

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::OverflowRecord::Unserialize<AutoFile>(OverflowRecord *this,AutoFile *s)

{
  long lVar1;
  uint32_t uVar2;
  AutoFile *in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  uint32_t in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator>>(in_RSI,(uchar *)in_RDI);
  AutoFile::operator>>(in_RSI,in_RDI);
  AutoFile::operator>>(in_RSI,in_RDI);
  if ((in_RDI[1] & 1) != 0) {
    uVar2 = internal_bswap_32(in_stack_ffffffffffffffdc);
    in_RDI[2] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffffdc);
    in_RDI[3] = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused2;
        s >> page_number;
        s >> item_len;

        if (m_header.other_endian) {
            page_number = internal_bswap_32(page_number);
            item_len = internal_bswap_32(item_len);
        }
    }